

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GmmUmdTranslationTable.cpp
# Opt level: O2

bool __thiscall
GmmLib::Table::TrackTableUsage
          (Table *this,TT_TYPE Type,bool IsL1,GMM_GFX_ADDRESS TileAdr,bool NullMapped,
          GMM_LIB_CONTEXT *pGmmLibContext)

{
  uint32_t *puVar1;
  ulong uVar2;
  uint uVar3;
  long lVar4;
  undefined7 in_register_00000011;
  byte bVar5;
  long lVar6;
  uint uVar7;
  bool bVar8;
  
  if ((int)CONCAT71(in_register_00000011,IsL1) == 0) {
    uVar3 = (uint)(TileAdr >> 0x18) & 0xfff;
  }
  else {
    uVar2 = *(ulong *)&(pGmmLibContext->WaTable).field_0x4;
    bVar5 = ((uVar2 >> 0x2f & 1) == 0) << 2 | 2;
    if ((uVar2 >> 0x2e & 1) != 0) {
      bVar5 = 0;
    }
    uVar3 = ((uint)(TileAdr >> 0xe) & 0x3ff) >> bVar5;
  }
  uVar7 = 1 << ((byte)uVar3 & 0x1f);
  if (NullMapped) {
    this->UsedEntries[uVar3 >> 5] = this->UsedEntries[uVar3 >> 5] & ~uVar7;
    lVar4 = 0x80;
    if ((IsL1) && (lVar4 = 0x20, ((pGmmLibContext->WaTable).field_0x9 & 0x40) == 0)) {
      lVar4 = 8;
    }
    lVar6 = 0;
    do {
      bVar8 = lVar4 == lVar6;
      if (bVar8) {
        return bVar8;
      }
      puVar1 = this->UsedEntries + lVar6;
      lVar6 = lVar6 + 1;
    } while (*puVar1 == 0);
  }
  else {
    this->UsedEntries[uVar3 >> 5] = this->UsedEntries[uVar3 >> 5] | uVar7;
    bVar8 = false;
  }
  return bVar8;
}

Assistant:

bool GmmLib::Table::TrackTableUsage(TT_TYPE Type, bool IsL1, GMM_GFX_ADDRESS TileAdr, bool NullMapped, GMM_LIB_CONTEXT *pGmmLibContext )
{
    uint32_t EntryIdx;
    uint32_t ElemNum = 0, BitNum = 0;

    EntryIdx = IsL1 ? static_cast<uint32_t>(GMM_L1_ENTRY_IDX(Type, TileAdr, pGmmLibContext)) : static_cast<uint32_t>(GMM_L2_ENTRY_IDX(Type, TileAdr));

    ElemNum = EntryIdx / (sizeof(UsedEntries[0]) * 8);
    BitNum  = EntryIdx % (sizeof(UsedEntries[0]) * 8);

    if(NullMapped)
    {
        UsedEntries[ElemNum] &= ~(1 << BitNum);
    }
    else
    {
        UsedEntries[ElemNum] |= (1 << BitNum);
    }

    if(NullMapped)
    {
        int TableDWSize = IsL1 ? static_cast<int>(GMM_L1_SIZE_DWORD(Type,  pGmmLibContext)) : static_cast<int>(GMM_L2_SIZE_DWORD(Type));
        for(int i = 0; i < TableDWSize; i++)
        {
            if(UsedEntries[i])
            {
                return false;
            }
        }
    }
    return NullMapped ? true : false;
}